

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_util.c
# Opt level: O3

char * str_replace(char *haystack,char *needle,char *replacement)

{
  char cVar1;
  int iVar2;
  string_buffer_t *sb;
  size_t sVar3;
  size_t sVar4;
  ulong uVar5;
  char *pcVar6;
  long lVar7;
  int iVar8;
  
  if (haystack == (char *)0x0) {
    __assert_fail("haystack != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/christianrauch[P]apriltag2/common/string_util.c"
                  ,0x280,"char *str_replace(const char *, const char *, const char *)");
  }
  if (needle == (char *)0x0) {
    __assert_fail("needle != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/christianrauch[P]apriltag2/common/string_util.c"
                  ,0x281,"char *str_replace(const char *, const char *, const char *)");
  }
  if (replacement == (char *)0x0) {
    __assert_fail("replacement != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/christianrauch[P]apriltag2/common/string_util.c"
                  ,0x282,"char *str_replace(const char *, const char *, const char *)");
  }
  sb = string_buffer_create();
  sVar3 = strlen(haystack);
  sVar4 = strlen(needle);
  if (sVar3 != 0) {
    uVar5 = 0;
    iVar8 = 0;
    do {
      if (sVar4 == 0) {
LAB_003d3216:
        string_buffer_append(sb,haystack[uVar5]);
        iVar2 = 1;
      }
      else {
        lVar7 = 0;
        do {
          cVar1 = needle[lVar7];
          if (haystack[lVar7 + uVar5] != cVar1) break;
          lVar7 = lVar7 + 1;
        } while (cVar1 != '\0');
        if (cVar1 != '\0') goto LAB_003d3216;
        string_buffer_append_string(sb,replacement);
        iVar2 = (int)sVar4;
      }
      iVar8 = iVar8 + iVar2;
      uVar5 = (ulong)iVar8;
    } while (uVar5 < sVar3);
  }
  if (sVar4 == 0 && sVar3 == 0) {
    string_buffer_append_string(sb,replacement);
  }
  pcVar6 = string_buffer_to_string(sb);
  string_buffer_destroy(sb);
  return pcVar6;
}

Assistant:

char *str_replace(const char *haystack, const char *needle, const char *replacement)
{
    assert(haystack != NULL);
    assert(needle != NULL);
    assert(replacement != NULL);

    string_buffer_t *sb = string_buffer_create();
    size_t haystack_len = strlen(haystack);
    size_t needle_len = strlen(needle);

    int pos = 0;
    while (pos < haystack_len) {
        if (needle_len > 0 && str_starts_with(&haystack[pos], needle)) {
            string_buffer_append_string(sb, replacement);
            pos += needle_len;
        } else {
            string_buffer_append(sb, haystack[pos]);
            pos++;
        }
    }
    if (needle_len == 0 && haystack_len == 0)
        string_buffer_append_string(sb, replacement);

    char *res = string_buffer_to_string(sb);
    string_buffer_destroy(sb);
    return res;
}